

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O0

BLOCK_SIZE scale_chroma_bsize(BLOCK_SIZE bsize,int subsampling_x,int subsampling_y)

{
  BLOCK_SIZE bs;
  int subsampling_y_local;
  int subsampling_x_local;
  BLOCK_SIZE bsize_local;
  
  bs = bsize;
  switch(bsize) {
  case BLOCK_4X4:
    if ((subsampling_x == 1) && (subsampling_y == 1)) {
      bs = BLOCK_8X8;
    }
    else if (subsampling_x == 1) {
      bs = BLOCK_8X4;
    }
    else if (subsampling_y == 1) {
      bs = BLOCK_4X8;
    }
    break;
  case BLOCK_4X8:
    if ((subsampling_x == 1) && (subsampling_y == 1)) {
      bs = BLOCK_8X8;
    }
    else if (subsampling_x == 1) {
      bs = BLOCK_8X8;
    }
    else if (subsampling_y == 1) {
      bs = BLOCK_4X8;
    }
    break;
  case BLOCK_8X4:
    if ((subsampling_x == 1) && (subsampling_y == 1)) {
      bs = BLOCK_8X8;
    }
    else if (subsampling_x == 1) {
      bs = BLOCK_8X4;
    }
    else if (subsampling_y == 1) {
      bs = BLOCK_8X8;
    }
    break;
  default:
    break;
  case BLOCK_4X16:
    if ((subsampling_x == 1) && (subsampling_y == 1)) {
      bs = BLOCK_8X16;
    }
    else if (subsampling_x == 1) {
      bs = BLOCK_8X16;
    }
    else if (subsampling_y == 1) {
      bs = BLOCK_4X16;
    }
    break;
  case BLOCK_16X4:
    if ((subsampling_x == 1) && (subsampling_y == 1)) {
      bs = BLOCK_16X8;
    }
    else if (subsampling_x == 1) {
      bs = BLOCK_16X4;
    }
    else if (subsampling_y == 1) {
      bs = BLOCK_16X8;
    }
  }
  return bs;
}

Assistant:

static inline BLOCK_SIZE scale_chroma_bsize(BLOCK_SIZE bsize, int subsampling_x,
                                            int subsampling_y) {
  assert(subsampling_x >= 0 && subsampling_x < 2);
  assert(subsampling_y >= 0 && subsampling_y < 2);
  BLOCK_SIZE bs = bsize;
  switch (bsize) {
    case BLOCK_4X4:
      if (subsampling_x == 1 && subsampling_y == 1)
        bs = BLOCK_8X8;
      else if (subsampling_x == 1)
        bs = BLOCK_8X4;
      else if (subsampling_y == 1)
        bs = BLOCK_4X8;
      break;
    case BLOCK_4X8:
      if (subsampling_x == 1 && subsampling_y == 1)
        bs = BLOCK_8X8;
      else if (subsampling_x == 1)
        bs = BLOCK_8X8;
      else if (subsampling_y == 1)
        bs = BLOCK_4X8;
      break;
    case BLOCK_8X4:
      if (subsampling_x == 1 && subsampling_y == 1)
        bs = BLOCK_8X8;
      else if (subsampling_x == 1)
        bs = BLOCK_8X4;
      else if (subsampling_y == 1)
        bs = BLOCK_8X8;
      break;
    case BLOCK_4X16:
      if (subsampling_x == 1 && subsampling_y == 1)
        bs = BLOCK_8X16;
      else if (subsampling_x == 1)
        bs = BLOCK_8X16;
      else if (subsampling_y == 1)
        bs = BLOCK_4X16;
      break;
    case BLOCK_16X4:
      if (subsampling_x == 1 && subsampling_y == 1)
        bs = BLOCK_16X8;
      else if (subsampling_x == 1)
        bs = BLOCK_16X4;
      else if (subsampling_y == 1)
        bs = BLOCK_16X8;
      break;
    default: break;
  }
  return bs;
}